

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ValidateModuleHeader(WasmBinaryReader *this)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  uint uVar6;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *pFVar7;
  uint32 version;
  uint32 magicNumber;
  uint32 bytesLeft;
  WasmBinaryReader *this_local;
  
  pbVar1 = this->m_end;
  pbVar2 = this->m_pc;
  uVar4 = Limits::GetMaxModuleSize();
  if (uVar4 < (uint)((int)pbVar1 - (int)pbVar2)) {
    ThrowDecodingError(this,L"Module too big");
  }
  uVar5 = ReadConst<unsigned_int>(this);
  uVar6 = ReadConst<unsigned_int>(this);
  pFVar7 = GetFunctionBody(this);
  if (pFVar7 == (FunctionBody *)0x0) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
  }
  else {
    pFVar7 = GetFunctionBody(this);
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
    pFVar7 = GetFunctionBody(this);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
  }
  if (bVar3) {
    Output::Print(L"Module Header: Magic 0x%x, Version %u",(ulong)uVar5,(ulong)uVar6);
    Output::Print(L"\n");
    Output::Flush();
  }
  if (uVar5 == 0x6d736100) {
    if (((DAT_01e9e240 & 1) != 0) && (uVar6 != 1)) {
      ThrowDecodingError(this,L"Invalid WASM version!");
    }
    return;
  }
  ThrowDecodingError(this,L"Malformed WASM module header!");
}

Assistant:

void WasmBinaryReader::ValidateModuleHeader()
{
    uint32 bytesLeft = (uint32)(m_end - m_pc);
    if (bytesLeft > Limits::GetMaxModuleSize())
    {
        ThrowDecodingError(_u("Module too big"));
    }

    uint32 magicNumber = ReadConst<uint32>();
    uint32 version = ReadConst<uint32>();
    TRACE_WASM_DECODER(_u("Module Header: Magic 0x%x, Version %u"), magicNumber, version);
    if (magicNumber != 0x6d736100)
    {
        ThrowDecodingError(_u("Malformed WASM module header!"));
    }

    if (CONFIG_FLAG(WasmCheckVersion))
    {
        if (version != binaryVersion)
        {
            ThrowDecodingError(_u("Invalid WASM version!"));
        }
    }
}